

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::InnerProduct3D_1D_1D::dim_forward
          (Dim *__return_storage_ptr__,InnerProduct3D_1D_1D *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  invalid_argument *piVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pDVar2;
  if (1 < (lVar4 >> 2) * -0x71c71c71c71c71c7 - 3U) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"Expected three or four arguments in InnerProduct3D_1D");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((pDVar2->nd == 3) && (pDVar2[1].nd == 1)) && (pDVar2[2].nd == 1)) {
    uVar1 = pDVar2->d[0];
    uVar5 = pDVar2[1].bd;
    if (pDVar2[1].bd < pDVar2->bd) {
      uVar5 = pDVar2->bd;
    }
    if (uVar5 <= pDVar2[2].bd) {
      uVar5 = pDVar2[2].bd;
    }
    __return_storage_ptr__->bd = uVar5;
    __return_storage_ptr__->nd = 1;
    __return_storage_ptr__->d[0] = uVar1;
    if (lVar4 == 0x90) {
      uVar1 = pDVar2[3].bd;
      uVar6 = uVar1;
      if (uVar1 < uVar5) {
        uVar6 = uVar5;
      }
      __return_storage_ptr__->bd = uVar6;
      if (((pDVar2[3].nd != 1) || (uVar1 < uVar5)) ||
         ((char)pDVar2[3].d[0] != (char)__return_storage_ptr__->d[0])) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Bad input dimensions in InnerProduct3D_1D_1D: ",0x2e);
        operator<<((ostream *)local_190,xs);
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar3,local_1b0);
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Bad input dimensions in InnerProduct3D_1D_1D: ",0x2e);
  operator<<((ostream *)local_190,xs);
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar3,local_1b0);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 3 && xs.size() != 4)
    throw std::invalid_argument("Expected three or four arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[2].ndims() != 1) {
    // TODO fix add check
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0)}, max(max(xs[0].bd, xs[1].bd), xs[2].bd));
  if(xs.size() == 4) d.bd = max(d.bd, xs[3].bd);
  if (xs.size() == 4 && xs[3] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}